

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

function __thiscall
pybind11::get_type_overload(pybind11 *this,void *this_ptr,type_info *this_type,char *name)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  *this_00;
  handle name_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  PyObject **ppPVar7;
  internals *piVar8;
  long lVar9;
  PyObject *pPVar10;
  pair<std::__detail::_Node_iterator<std::pair<const__object_*,_const_char_*>,_true,_true>,_bool>
  pVar11;
  PyObject *self_caller;
  handle local_108;
  str local_100;
  str local_f8 [4];
  long local_d8;
  PyFrameObject *frame;
  _Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true> local_c8;
  undefined1 local_c0;
  pair<const__object_*,_const_char_*> local_b8 [2];
  handle local_98;
  PyObject *local_90;
  handle local_88;
  object local_80;
  function local_78;
  function overload;
  pair<const__object_*,_const_char_*> local_68;
  _Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true> local_58;
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  *local_50;
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  *cache;
  pair<_object_*,_const_char_*> key;
  handle type;
  handle self;
  char *name_local;
  type_info *this_type_local;
  void *this_ptr_local;
  
  self.m_ptr = (PyObject *)name;
  type = detail::get_object_handle(this_ptr,this_type);
  bVar4 = handle::operator_cast_to_bool(&type);
  if (!bVar4) {
    function::function((function *)this);
    return (object)(object)this;
  }
  key.second = (char *)detail::object_api<pybind11::handle>::get_type
                                 ((object_api<pybind11::handle> *)&type);
  ppPVar7 = handle::ptr((handle *)&key.second);
  _cache = std::make_pair<_object*&,char_const*&>(ppPVar7,(char **)&self);
  piVar8 = detail::get_internals();
  local_50 = &piVar8->inactive_overload_cache;
  std::pair<const__object_*,_const_char_*>::pair<_object_*,_const_char_*,_true>
            (&local_68,(pair<_object_*,_const_char_*> *)&cache);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
       ::find(&piVar8->inactive_overload_cache,&local_68);
  overload.super_object.super_handle.m_ptr =
       (object)std::
               unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
               ::end(local_50);
  bVar4 = std::__detail::operator!=
                    (&local_58,
                     (_Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true> *)
                     &overload);
  name_00 = self;
  if (bVar4) {
    function::function((function *)this);
    return (object)(object)this;
  }
  local_88.m_ptr = type.m_ptr;
  function::function((function *)&local_98);
  local_90 = local_98.m_ptr;
  getattr((pybind11 *)&local_80,local_88,(char *)name_00.m_ptr,local_98);
  function::function(&local_78,&local_80);
  object::~object(&local_80);
  function::~function((function *)&local_98);
  bVar4 = function::is_cpp_function(&local_78);
  this_00 = local_50;
  if (bVar4) {
    std::pair<const__object_*,_const_char_*>::pair<_object_*,_const_char_*,_true>
              (local_b8,(pair<_object_*,_const_char_*> *)&cache);
    pVar11 = std::
             unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
             ::insert(this_00,local_b8);
    local_c8._M_cur =
         (__node_type *)
         pVar11.first.super__Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true>.
         _M_cur;
    local_c0 = pVar11.second;
    function::function((function *)this);
  }
  else {
    lVar9 = PyThreadState_Get();
    local_d8 = *(long *)(lVar9 + 0x18);
    bVar3 = false;
    bVar2 = false;
    bVar4 = false;
    if (local_d8 != 0) {
      handle::handle(&local_108,*(PyObject **)(*(long *)(local_d8 + 0x20) + 0x70));
      str::str(&local_100,local_108);
      bVar3 = true;
      str::operator_cast_to_string(local_f8);
      bVar2 = true;
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f8,(char *)self.m_ptr);
      bVar4 = false;
      if (bVar5) {
        bVar4 = 0 < *(int *)(*(long *)(local_d8 + 0x20) + 0x10);
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)local_f8);
    }
    if (bVar3) {
      str::~str(&local_100);
    }
    if (bVar4) {
      PyFrame_FastToLocals(local_d8);
      uVar1 = *(undefined8 *)(local_d8 + 0x38);
      iVar6 = PyType_HasFeature(*(PyTypeObject **)(*(long *)(*(long *)(local_d8 + 0x20) + 0x48) + 8)
                                ,0x4000000);
      if (iVar6 == 0) {
        __assert_fail("PyTuple_Check(frame->f_code->co_varnames)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                      ,0x6e7,
                      "function pybind11::get_type_overload(const void *, const detail::type_info *, const char *)"
                     );
      }
      pPVar10 = (PyObject *)
                PyDict_GetItem(uVar1,*(undefined8 *)
                                      (*(long *)(*(long *)(local_d8 + 0x20) + 0x48) + 0x18));
      ppPVar7 = handle::ptr(&type);
      if (pPVar10 == *ppPVar7) {
        function::function((function *)this);
        goto LAB_0014ff43;
      }
    }
    function::function((function *)this,&local_78);
  }
LAB_0014ff43:
  frame._4_4_ = 1;
  function::~function(&local_78);
  return (object)(object)this;
}

Assistant:

inline function get_type_overload(const void *this_ptr, const detail::type_info *this_type, const char *name)  {
    handle self = detail::get_object_handle(this_ptr, this_type);
    if (!self)
        return function();
    handle type = self.get_type();
    auto key = std::make_pair(type.ptr(), name);

    /* Cache functions that aren't overloaded in Python to avoid
       many costly Python dictionary lookups below */
    auto &cache = detail::get_internals().inactive_overload_cache;
    if (cache.find(key) != cache.end())
        return function();

    function overload = getattr(self, name, function());
    if (overload.is_cpp_function()) {
        cache.insert(key);
        return function();
    }

    /* Don't call dispatch code if invoked from overridden function.
       Unfortunately this doesn't work on PyPy. */
#if !defined(PYPY_VERSION)
    PyFrameObject *frame = PyThreadState_Get()->frame;
    if (frame && (std::string) str(frame->f_code->co_name) == name &&
        frame->f_code->co_argcount > 0) {
        PyFrame_FastToLocals(frame);
        PyObject *self_caller = PyDict_GetItem(
            frame->f_locals, PyTuple_GET_ITEM(frame->f_code->co_varnames, 0));
        if (self_caller == self.ptr())
            return function();
    }
#else
    /* PyPy currently doesn't provide a detailed cpyext emulation of
       frame objects, so we have to emulate this using Python. This
       is going to be slow..*/
    dict d; d["self"] = self; d["name"] = pybind11::str(name);
    PyObject *result = PyRun_String(
        "import inspect\n"
        "frame = inspect.currentframe()\n"
        "if frame is not None:\n"
        "    frame = frame.f_back\n"
        "    if frame is not None and str(frame.f_code.co_name) == name and "
        "frame.f_code.co_argcount > 0:\n"
        "        self_caller = frame.f_locals[frame.f_code.co_varnames[0]]\n"
        "        if self_caller == self:\n"
        "            self = None\n",
        Py_file_input, d.ptr(), d.ptr());
    if (result == nullptr)
        throw error_already_set();
    if ((handle) d["self"] == Py_None)
        return function();
    Py_DECREF(result);
#endif

    return overload;
}